

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

token_t * get_token(void)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  ushort **ppuVar13;
  char *pcVar14;
  size_t sVar15;
  token_t *ptVar16;
  char *pcVar17;
  byte *pbVar18;
  int bc;
  int iVar19;
  int bl;
  int iVar20;
  char *pcVar21;
  int *piVar22;
  uint uVar23;
  long lVar24;
  undefined8 local_440;
  byte local_438 [1032];
  
  bVar6 = false;
  do {
    readbyte();
    iVar20 = 0x31;
    ppuVar13 = __ctype_b_loc();
    do {
      while ((*(byte *)((long)*ppuVar13 + (long)c * 2 + 1) & 0x20) != 0) {
        readbyte();
      }
      iVar19 = 0;
      if ((c == 0x2f) && ((l == 0x2f || (iVar19 = 0, l == 0x2a)))) {
        eline = line;
        ecolumn = column;
        readbyte();
        iVar19 = iVar20;
        if (c == 0x2a) {
          do {
            readbyte();
            if (c == -1) {
              err(E,"unterminated comment");
              break;
            }
          } while ((c != 0x2a) || (l != 0x2f));
          readbyte();
          readbyte();
        }
        else {
          do {
            readbyte();
          } while (c != 10);
        }
      }
      iVar20 = iVar19;
      iVar19 = c;
      uVar7 = column;
      uVar23 = line;
    } while (iVar20 != 0);
    eline = line;
    ecolumn = column;
    lVar24 = (long)c;
    t.id = c;
    t.line = line;
    t.column = column;
    if (((lVar24 == 0x23) && (prev == 10)) &&
       (ppuVar13 = __ctype_b_loc(), (*(byte *)((long)*ppuVar13 + (long)l * 2 + 1) & 0x20) != 0)) {
      pcVar21 = pp_get_token();
      uVar23 = line;
      if (pcVar21 == (char *)0x0) goto LAB_00104c49;
      cVar12 = *pcVar21;
      if (cVar12 == '\0') goto LAB_00104728;
      pcVar17 = pcVar21;
      break;
    }
    if (iVar19 == -1) goto switchD_001044f4_caseD_25;
    ppuVar13 = __ctype_b_loc();
    if ((iVar19 == 0x5f) || (((*ppuVar13)[lVar24] & 0x400) != 0)) {
      t.id = 0x86;
      t.string[0] = (char)iVar19;
      if (((long)l == 0x5f) || (((*ppuVar13)[l] & 8) != 0)) {
        pcVar21 = t.string + 1;
        iVar20 = 1;
        do {
          readbyte();
          if (iVar20 < 0x1f) {
            *pcVar21 = (byte)c;
            pcVar21 = pcVar21 + 1;
            iVar20 = iVar20 + 1;
          }
        } while (((long)l == 0x5f) || (((*ppuVar13)[l] & 8) != 0));
        *pcVar21 = '\0';
        if (0x1e < iVar20) {
          err(W,"too long identifier has been truncated to %d characters.",0x1f);
        }
      }
      else {
        t.string[1] = '\0';
      }
      if (t.string[4] == '\0' &&
          CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
          0x65747962) {
        t.id = 0x80;
      }
      else if (CONCAT22(t.string._5_2_,CONCAT11(t.string[4],t.string[3])) == 0x6e7275 &&
               CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
               0x75746572) {
        t.id = 0x83;
      }
      else if (t.string[4] == '\0' &&
               CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
               0x64696f76) {
        t.id = 0x84;
      }
      else if (t.string[4] == '\0' &&
               CONCAT13(t.string[3],CONCAT12(t.string[2],CONCAT11(t.string[1],t.string[0]))) ==
               0x64726f77) {
        t.id = 0x85;
      }
      goto switchD_001044f4_caseD_25;
    }
    if (((*ppuVar13)[lVar24] >> 0xb & 1) != 0) {
      t.id = 0x87;
      t._unsigned = 0;
      t._word = 0;
      if (iVar19 == 0x30) {
        t.constant = 0;
        iVar20 = 8;
        if ((l & 0xffffffdfU) == 0x58) {
          lVar24 = ftell((FILE *)f);
          readbyte();
          iVar20 = 0x10;
          if ((((*ppuVar13)[l] >> 0xb & 1) == 0) &&
             ((0x25 < l - 0x41U || ((0x3f0000003fU >> ((ulong)(l - 0x41U) & 0x3f) & 1) == 0)))) {
            fseek((FILE *)f,lVar24,0);
            l = c;
            line = uVar23;
            column = uVar7;
          }
        }
      }
      else {
        t.constant = iVar19 - 0x30;
        iVar20 = 10;
      }
      bVar2 = false;
      bVar5 = false;
      goto LAB_001048ed;
    }
    switch(iVar19) {
    case 0x21:
      goto switchD_001044f4_caseD_21;
    case 0x25:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2f:
    case 0x3b:
      goto switchD_001044f4_caseD_25;
    case 0x3c:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x8a;
      }
      goto switchD_001044f4_caseD_25;
    case 0x3d:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x88;
      }
      goto switchD_001044f4_caseD_25;
    case 0x3e:
      if (l == 0x3d) {
        readbyte();
        t.id = 0x8b;
      }
      goto switchD_001044f4_caseD_25;
    default:
      if ((iVar19 - 0x5bU < 0x23) && ((0x500000005U >> ((ulong)(iVar19 - 0x5bU) & 0x3f) & 1) != 0))
      goto switchD_001044f4_caseD_25;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
      pcVar21 = "stray \"%c\" in program";
      if (iVar19 - 0x7fU < 0xffffffa1) {
        pcVar21 = "stray \'%o\' in program";
      }
      err(E,pcVar21,(ulong)(uint)iVar19);
      if (!bVar6) {
        local_440 = &t;
      }
      bVar6 = true;
    }
  } while( true );
  while (cVar12 = *pcVar17, cVar12 != '\0') {
    pcVar17 = pcVar17 + 1;
    if ((*(byte *)((long)*ppuVar13 + (long)cVar12 * 2 + 1) & 8) == 0) goto LAB_001047cd;
  }
LAB_00104728:
  iVar20 = atoi(pcVar21);
  uVar23 = iVar20 - 1;
  pcVar17 = pp_get_token();
  pcVar21 = pcVar17;
  if (pcVar17 != (char *)0x0) {
    do {
      pcVar14 = pcVar21;
      pcVar21 = pcVar14 + 1;
    } while (*pcVar14 != '\0');
    if ((*pcVar17 == '\"') && (pcVar14[-1] == '\"')) {
      strcpy((char *)local_438,pcVar17 + 1);
      sVar15 = strlen(pcVar17 + 1);
      local_438[sVar15 - 1] = 0;
      pcVar21 = pp_get_token();
      if (pcVar21 == (char *)0x0) {
        esetfile((char *)local_438);
      }
      else {
        err(E,"unexpected flag \"%s\" in line directive",pcVar21);
        while ((l != -1 && (l != 10))) {
          readbyte();
        }
        line = uVar23;
        esetfile((char *)local_438);
        uVar23 = line;
      }
    }
    else {
      err(E,"\"%s\" is not a valid filename",pcVar17);
      while ((l != -1 && (l != 10))) {
        readbyte();
      }
    }
  }
LAB_00104c49:
  line = uVar23;
  get_token();
  goto switchD_001044f4_caseD_25;
LAB_001047cd:
  while ((l != -1 && (l != 10))) {
    readbyte();
  }
  err(E,"invalid line number \"%s\"",pcVar21);
  uVar23 = line;
  goto LAB_00104c49;
LAB_00104b73:
  err(E,"invalid suffix \"%s%s\" after integer constant",local_438,pcVar21);
  goto switchD_001044f4_caseD_25;
switchD_001044f4_caseD_21:
  if (l == 0x3d) {
    readbyte();
    t.id = 0x89;
  }
  goto switchD_001044f4_caseD_25;
LAB_001048ed:
  iVar19 = -1;
  if (iVar20 == 8) {
    if ((*(byte *)((long)*ppuVar13 + (long)l * 2 + 1) & 8) != 0) {
      readbyte();
      iVar9 = ecolumn;
      iVar8 = eline;
      if ((c & 0xfffffff8U) == 0x30) {
        iVar19 = c + -0x30;
        eline = iVar8;
        ecolumn = iVar9;
      }
      else {
        err(E,"invalid digit \"%c\" in octal constant");
        eline = iVar8;
        ecolumn = iVar9;
      }
    }
  }
  else if (iVar20 == 0x10) {
    if ((*(byte *)((long)*ppuVar13 + (long)l * 2 + 1) & 8) != 0) goto LAB_0010494a;
    if (l - 0x61U < 6) {
      readbyte();
      iVar19 = c + -0x57;
    }
    else if (l - 0x41U < 6) {
      readbyte();
      iVar19 = c + -0x37;
    }
  }
  else if ((iVar20 == 10) && ((*(byte *)((long)*ppuVar13 + (long)l * 2 + 1) & 8) != 0)) {
LAB_0010494a:
    readbyte();
    iVar19 = c + -0x30;
  }
  if (iVar19 != -1) {
    t.constant = t.constant * iVar20 + iVar19;
    if (0xff < t.constant) {
      bVar5 = true;
    }
    if (0xffff < t.constant) {
      bVar2 = true;
    }
    goto LAB_001048ed;
  }
  if (((long)l == 0x5f) || (((*ppuVar13)[l] & 0x400) != 0)) {
    readbyte();
    pbVar18 = local_438 + 1;
    local_438[0] = (byte)c;
    if (((*ppuVar13)[l] & 8) == 0) {
      pcVar21 = "";
    }
    else {
      iVar20 = 1;
      do {
        readbyte();
        if (iVar20 < 8) {
          *pbVar18 = (byte)c;
          pbVar18 = pbVar18 + 1;
          iVar20 = iVar20 + 1;
        }
      } while (((*ppuVar13)[l] & 8) != 0);
      pcVar21 = "";
      if (iVar20 == 8) {
        pcVar21 = "...";
      }
    }
    *pbVar18 = 0;
    bVar3 = false;
    pbVar18 = local_438;
    bVar4 = false;
    do {
      bVar1 = *pbVar18;
      if (bVar1 < 0x75) {
        if (bVar1 != 0x55) {
          if (bVar1 != 0) goto LAB_00104b53;
          break;
        }
LAB_00104b3c:
        piVar22 = &t._unsigned;
        bVar10 = true;
        bVar11 = bVar4;
        if (bVar3) goto LAB_00104b73;
      }
      else {
        if (bVar1 != 0x77) {
          if (bVar1 == 0x75) goto LAB_00104b3c;
LAB_00104b53:
          if (bVar1 != 0x57) goto LAB_00104b73;
        }
        piVar22 = &t._word;
        bVar10 = bVar3;
        bVar11 = true;
        if (bVar4) goto LAB_00104b73;
      }
      bVar4 = bVar11;
      bVar3 = bVar10;
      *piVar22 = 1;
      pbVar18 = pbVar18 + 1;
    } while( true );
  }
  if (t._word == 0) {
    if (0x7f < t.constant && t._unsigned == 0) {
      t._unsigned = 1;
      t._word = 0;
    }
    if (!bVar5) goto switchD_001044f4_caseD_25;
    t.constant = t.constant & 0xff;
  }
  else {
    if (0x7fff < t.constant && t._unsigned == 0) {
      t._unsigned = 1;
    }
    if (!bVar2) goto switchD_001044f4_caseD_25;
    t.constant = t.constant & 0xffff;
  }
  t._unsigned = 1;
  err(W,"numeric constant is too large for its type");
switchD_001044f4_caseD_25:
  ptVar16 = &t;
  if (bVar6) {
    ptVar16 = local_440;
  }
  return ptVar16;
}

Assistant:

token_t* get_token()
{
    int skip = '1';

    readbyte();

    while (skip)
    {
        while (isspace(c))
            readbyte();

        if (c == '/' && (l == '*' || l == '/'))
        {
            eline = line;
            ecolumn = column;

            readbyte();
            if (c == '*')
            {
                do
                {
                    readbyte();
                    if (c == EOF)
                    {
                        err(E, "unterminated comment");
                        break;
                    }
                } while (!(c == '*' && l == '/'));
                readbyte();
                readbyte();
            }
            else
            {
                do
                {
                    readbyte();
                } while (c != '\n');
            }
        }
        else
            skip = 0;
    }

    eline = line;
    ecolumn = column;

    t.id = c;
    t.line = line;
    t.column = column;

    if (c == '#' && prev == '\n' && isspace(l))
    {
        parse_pp_info();
        return get_token();
    }

    if (c == EOF)
    {
    }
    else if (isalpha(c) || c == '_')
    {
        char* p = t.string;
        int len = 1;
        t.id = IDENTIFIER;

        *p++ = c;
        while (isalnum(l) || l == '_')
        {
            readbyte();
            if (len < MAX_ID_LEN)
            {
                *p++ = c;
                ++len;
            }
        }
        *p = 0;

        if (len >= MAX_ID_LEN)
        {
            err(W, "too long identifier has been truncated to %d characters.",
                 MAX_ID_LEN);
        }

        if (strcmp(t.string, "byte") == 0)
            t.id = BYTE;
        else if (strcmp(t.string, "return") == 0)
            t.id = RETURN;
        else if (strcmp(t.string, "void") == 0)
            t.id = VOID;
        else if (strcmp(t.string, "word") == 0)
            t.id = WORD;
    }
    else if (isdigit(c))
    {
        t.id = CONSTANT;
        t._unsigned = 0;
        t._word = 0;
        parse_num();
    }
    else if ( c == '>')
    {
        if (l == '=')
        {
            readbyte();
            t.id = GE_OP;
        }
    }
    else if (c == '<')
    {
        if (l == '=')
        {
            readbyte();
            t.id = LE_OP;
        }
    }
    else if (c == '!')
    {
        if (l == '=')
        {
            readbyte();
            t.id = NE_OP;
        }
    }
    else if (c == '=')
    {
        if (l == '=')
        {
            readbyte();
            t.id = EQ_OP;
        }
    }
    else if (c == '-')
    {
    }
    else if (c == '+')
    {
    }
    else if (c == '*')
    {
    }
    else if (c == '/')
    {
    }
    else if (c == '%')
    {
    }
    else if (   c == '(' || c == ')'
             || c == '{' || c == '}'
             || c == '[' || c == ']'
             || c == ';' || c == ',')
    {
    }
    else
    {
        if (c < ' ' || c >= 127)
            err(E, "stray '%o' in program", c);
        else
            err(E, "stray \"%c\" in program", c);
        return get_token();
    }

    return &t;
}